

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O1

void __thiscall
sglr::ShaderProgram::ShaderProgram(ShaderProgram *this,ShaderProgramDeclaration *decl)

{
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  bool bVar1;
  GenericVecType GVar2;
  pointer pcVar3;
  pointer pVVar4;
  pointer pFVar5;
  pointer pFVar6;
  vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
  *pvVar7;
  size_t numVaryingInputs;
  pointer *ppVVar8;
  pointer *ppVVar9;
  pointer pVVar10;
  pointer pGVar11;
  pointer pVVar12;
  size_t numVaryingOutputs;
  pointer pVVar13;
  ulong uVar14;
  vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
  *pvVar15;
  long lVar16;
  long lVar17;
  allocator_type local_6a;
  allocator_type local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  FragmentShader *local_40;
  GeometryShader *local_38;
  
  ppVVar8 = &(decl->m_vertexToFragmentVaryings).
             super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppVVar9 = &(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pvVar7 = (vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
            *)&decl->m_vertexToGeometryVaryings;
  if (decl->m_geometryShaderSet == false) {
    ppVVar9 = (pointer *)ppVVar8;
    pvVar7 = &decl->m_vertexToFragmentVaryings;
  }
  rr::VertexShader::VertexShader
            (&this->super_VertexShader,
             ((long)(decl->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(decl->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
             (long)*ppVVar9 -
             (long)(pvVar7->
                   super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_38 = &this->super_GeometryShader;
  numVaryingOutputs =
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  numVaryingInputs =
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (decl->m_geometryShaderSet == false) {
    numVaryingOutputs = 0;
    numVaryingInputs = 0;
  }
  rr::GeometryShader::GeometryShader
            (local_38,numVaryingInputs,numVaryingOutputs,(decl->m_geometryDecl).inputType,
             (decl->m_geometryDecl).outputType,(decl->m_geometryDecl).numOutputVertices,
             (decl->m_geometryDecl).numInvocations);
  local_40 = &this->super_FragmentShader;
  pvVar15 = (vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             *)&decl->m_vertexToFragmentVaryings;
  if (decl->m_geometryShaderSet != false) {
    pvVar15 = &decl->m_geometryToFragmentVaryings;
    ppVVar8 = (pointer *)
              &(decl->m_geometryToFragmentVaryings).
               super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  rr::FragmentShader::FragmentShader
            (local_40,(long)*ppVVar8 -
                      (long)(((_Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                               *)&pvVar15->
                                  super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                             )->_M_impl).super__Vector_impl_data._M_start >> 3,
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_00b6db48;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00b6db80;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00b6db98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_attributeNames,
           ((long)(decl->m_vertexAttributes).
                  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(decl->m_vertexAttributes).
                  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&local_69);
  this_00 = &this->m_uniforms;
  local_48 = &this->m_attributeNames;
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::vector
            (this_00,((long)(decl->m_uniforms).
                            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(decl->m_uniforms).
                            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
             &local_6a);
  local_60 = &(this->m_vertSrc).field_2;
  (this->m_vertSrc)._M_dataplus._M_p = (pointer)local_60;
  pcVar3 = (decl->m_vertexSource)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_vertSrc,pcVar3,pcVar3 + (decl->m_vertexSource)._M_string_length);
  local_58 = &this->m_fragSrc;
  local_68 = &(this->m_fragSrc).field_2;
  (this->m_fragSrc)._M_dataplus._M_p = (pointer)local_68;
  pcVar3 = (decl->m_fragmentSource)._M_dataplus._M_p;
  local_50 = &this->m_vertSrc;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + (decl->m_fragmentSource)._M_string_length);
  if (decl->m_geometryShaderSet == true) {
    (this->m_geomSrc)._M_dataplus._M_p = (pointer)&(this->m_geomSrc).field_2;
    pcVar3 = (decl->m_geometrySource)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->m_geomSrc,pcVar3,pcVar3 + (decl->m_geometrySource)._M_string_length)
    ;
  }
  else {
    (this->m_geomSrc)._M_dataplus._M_p = (pointer)&(this->m_geomSrc).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_geomSrc,0x98644f);
  }
  this->m_hasGeometryShader = decl->m_geometryShaderSet;
  pVVar13 = (decl->m_vertexAttributes).
            super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((decl->m_vertexAttributes).
      super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar13) {
    lVar16 = 0;
    lVar17 = 0;
    uVar14 = 0;
    do {
      (this->super_VertexShader).m_inputs.
      super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14].type =
           *(GenericVecType *)((long)&pVVar13->type + lVar17);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this->m_attributeNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
      uVar14 = uVar14 + 1;
      pVVar13 = (decl->m_vertexAttributes).
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x28;
      lVar16 = lVar16 + 0x20;
    } while (uVar14 < (ulong)(((long)(decl->m_vertexAttributes).
                                     super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar13 >> 3
                              ) * -0x3333333333333333));
  }
  if (this->m_hasGeometryShader == false) {
    pVVar12 = (decl->m_vertexToFragmentVaryings).
              super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_vertexToFragmentVaryings).
        super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pVVar12) {
      uVar14 = 0;
      do {
        GVar2 = pVVar12[uVar14].type;
        pVVar4 = (this->super_VertexShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].type = GVar2;
        bVar1 = pVVar12[uVar14].flatshade;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4 = (this->super_FragmentShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4[uVar14].type = GVar2;
        uVar14 = uVar14 + 1;
        pVVar12 = (decl->m_vertexToFragmentVaryings).
                  super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(decl->m_vertexToFragmentVaryings).
                                      super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar12 >>
                               3));
    }
  }
  else {
    pVVar10 = (decl->m_vertexToGeometryVaryings).
              super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_vertexToGeometryVaryings).
        super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pVVar10) {
      uVar14 = 0;
      do {
        GVar2 = pVVar10[uVar14].type;
        pVVar4 = (this->super_VertexShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].type = GVar2;
        bVar1 = pVVar10[uVar14].flatshade;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4 = (this->super_GeometryShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4[uVar14].type = GVar2;
        uVar14 = uVar14 + 1;
        pVVar10 = (decl->m_vertexToGeometryVaryings).
                  super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(decl->m_vertexToGeometryVaryings).
                                      super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >>
                               3));
    }
    pGVar11 = (decl->m_geometryToFragmentVaryings).
              super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_geometryToFragmentVaryings).
        super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pGVar11) {
      uVar14 = 0;
      do {
        GVar2 = pGVar11[uVar14].type;
        pVVar4 = (this->super_GeometryShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].type = GVar2;
        bVar1 = pGVar11[uVar14].flatshade;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4 = (this->super_FragmentShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4[uVar14].flatshade = bVar1;
        pVVar4[uVar14].type = GVar2;
        uVar14 = uVar14 + 1;
        pGVar11 = (decl->m_geometryToFragmentVaryings).
                  super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(decl->m_geometryToFragmentVaryings).
                                      super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar11 >>
                               3));
    }
  }
  pFVar5 = (decl->m_fragmentOutputs).
           super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = (long)(decl->m_fragmentOutputs).
                 super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5;
  if (lVar16 != 0) {
    lVar16 = lVar16 >> 2;
    pFVar6 = (this->super_FragmentShader).m_outputs.
             super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      pFVar6[lVar17].type = pFVar5[lVar17].type;
      lVar17 = lVar17 + 1;
    } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
  }
  if ((decl->m_uniforms).
      super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (decl->m_uniforms).
      super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar16 = 0;
    lVar17 = 0;
    uVar14 = 0;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this_00->
                           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar16));
      *(undefined4 *)
       ((long)&((this_00->super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>)
                ._M_impl.super__Vector_impl_data._M_start)->type + lVar16) =
           *(undefined4 *)
            ((long)&((decl->m_uniforms).
                     super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>.
                     _M_impl.super__Vector_impl_data._M_start)->type + lVar17);
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x28;
      lVar16 = lVar16 + 0x70;
    } while (uVar14 < (ulong)(((long)(decl->m_uniforms).
                                     super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(decl->m_uniforms).
                                     super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const pdec::ShaderProgramDeclaration& decl)
	: rr::VertexShader		(decl.getVertexInputCount(), decl.getVertexOutputCount())
	, rr::GeometryShader	(decl.getGeometryInputCount(),
							 decl.getGeometryOutputCount(),
							 decl.m_geometryDecl.inputType,
							 decl.m_geometryDecl.outputType,
							 decl.m_geometryDecl.numOutputVertices,
							 decl.m_geometryDecl.numInvocations)
	, rr::FragmentShader	(decl.getFragmentInputCount(), decl.getFragmentOutputCount())
	, m_attributeNames		(decl.getVertexInputCount())
	, m_uniforms			(decl.m_uniforms.size())
	, m_vertSrc				(decl.m_vertexSource)
	, m_fragSrc				(decl.m_fragmentSource)
	, m_geomSrc				(decl.hasGeometryShader() ? (decl.m_geometrySource) : (""))
	, m_hasGeometryShader	(decl.hasGeometryShader())
{
	DE_ASSERT(decl.valid());

	// Set up shader IO

	for (size_t ndx = 0; ndx < decl.m_vertexAttributes.size(); ++ndx)
	{
		this->rr::VertexShader::m_inputs[ndx].type	= decl.m_vertexAttributes[ndx].type;
		m_attributeNames[ndx]						= decl.m_vertexAttributes[ndx].name;
	}

	if (m_hasGeometryShader)
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToGeometryVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToGeometryVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToGeometryVaryings[ndx].flatshade;

			this->rr::GeometryShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
		for (size_t ndx = 0; ndx < decl.m_geometryToFragmentVaryings.size(); ++ndx)
		{
			this->rr::GeometryShader::m_outputs[ndx].type		= decl.m_geometryToFragmentVaryings[ndx].type;
			this->rr::GeometryShader::m_outputs[ndx].flatshade	= decl.m_geometryToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::GeometryShader::m_outputs[ndx];
		}
	}
	else
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToFragmentVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToFragmentVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
	}

	for (size_t ndx = 0; ndx < decl.m_fragmentOutputs.size(); ++ndx)
		this->rr::FragmentShader::m_outputs[ndx].type = decl.m_fragmentOutputs[ndx].type;

	// Set up uniforms

	for (size_t ndx = 0; ndx < decl.m_uniforms.size(); ++ndx)
	{
		this->m_uniforms[ndx].name = decl.m_uniforms[ndx].name;
		this->m_uniforms[ndx].type = decl.m_uniforms[ndx].type;
	}
}